

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QObject_const*>::
appendIteratorRange<QHash<QObject_const*,QList<QCss::StyleRule>>::key_iterator>
          (QCommonArrayOps<QObject_const*> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<const_QObject_*,_QList<QCss::StyleRule>_>::key_iterator> param_3
          )

{
  long lVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *pDVar3;
  undefined8 *puVar4;
  
  uVar2 = b.i.i.bucket;
  pDVar3 = b.i.i.d;
  if (uVar2 != e.i.i.bucket || pDVar3 != e.i.i.d) {
    lVar1 = *(long *)(this + 0x10);
    puVar4 = (undefined8 *)(lVar1 * 8 + *(long *)(this + 8));
    do {
      *puVar4 = *(undefined8 *)
                 pDVar3->spans[uVar2 >> 7].entries
                 [pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].storage.data;
      lVar1 = lVar1 + 1;
      *(long *)(this + 0x10) = lVar1;
      puVar4 = puVar4 + 1;
      do {
        if (pDVar3->numBuckets - 1 == uVar2) {
          pDVar3 = (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0;
          uVar2 = 0;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    } while (uVar2 != e.i.i.bucket || pDVar3 != e.i.i.d);
  }
  return;
}

Assistant:

bool operator==(iterator other) const noexcept
    { return d == other.d && bucket == other.bucket; }